

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Iter __thiscall mocker::ir::Interpreter::readStringLiteral(Interpreter *this,Iter iter,Iter end)

{
  char cVar1;
  char *pcVar2;
  
  if (end._M_current <= iter._M_current) {
    __assert_fail("iter < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                  ,0x45,
                  "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
                 );
  }
  if (*iter._M_current == '\"') {
    pcVar2 = iter._M_current + 1;
    while( true ) {
      while (cVar1 = *pcVar2, cVar1 == '\\') {
        pcVar2 = pcVar2 + 2;
        if (end._M_current <= pcVar2) {
          __assert_fail("iter < end",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                        ,0x4b,
                        "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
                       );
        }
      }
      pcVar2 = pcVar2 + 1;
      if (cVar1 == '\"') break;
      if (pcVar2 == end._M_current) {
        __assert_fail("iter != end",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x4f,
                      "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
                     );
      }
    }
    return (Iter)pcVar2;
  }
  __assert_fail("*iter == \'\\\"\'",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                ,0x46,
                "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
               );
}

Assistant:

Interpreter::Iter Interpreter::readStringLiteral(Interpreter::Iter iter,
                                                 Interpreter::Iter end) const {
  assert(iter < end);
  assert(*iter == '\"');
  ++iter;
  while (*iter != '\"') {
    if (*iter == '\\') {
      iter += 2;
      assert(iter < end);
      continue;
    }
    ++iter;
    assert(iter != end);
  }
  return iter + 1;
}